

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type * __thiscall
FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
::val(value_type *__return_storage_ptr__,
     FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
     *this)

{
  uint uVar1;
  double *pdVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  value_type local_60;
  value_type local_40;
  
  FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>::val
            (&local_40,&this->left_->fadexpr_);
  FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::val(&local_60,&this->right_->fadexpr_);
  uVar1 = local_60.dx_.num_elts;
  if (local_60.dx_.num_elts < local_40.dx_.num_elts) {
    uVar1 = local_40.dx_.num_elts;
  }
  __return_storage_ptr__->val_ = local_40.val_ + local_60.val_;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if ((int)uVar1 < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = uVar1;
    pdVar2 = (double *)operator_new__((ulong)uVar1 * 8);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar2;
    __return_storage_ptr__->defaultVal = 0.0;
    uVar3 = 0;
    do {
      pdVar4 = local_40.dx_.ptr_to_data;
      if (local_40.dx_.num_elts == 0) {
        pdVar4 = &local_40.defaultVal;
      }
      pdVar5 = local_60.dx_.ptr_to_data;
      if (local_60.dx_.num_elts == 0) {
        pdVar5 = &local_60.defaultVal;
      }
      pdVar2[uVar3] = *pdVar4 + *pdVar5;
      uVar3 = uVar3 + 1;
      local_60.dx_.ptr_to_data = local_60.dx_.ptr_to_data + 1;
      local_40.dx_.ptr_to_data = local_40.dx_.ptr_to_data + 1;
    } while (uVar1 != uVar3);
  }
  Fad<double>::~Fad(&local_60);
  Fad<double>::~Fad(&local_40);
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return left_.val() + right_.val();}